

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O3

RecyclerTestObject * TrackedObject<1U,_50U>::New(void)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  Recycler *this;
  RecyclerTestObject *memBlock;
  HeapBlock *pHVar6;
  type_info *__n;
  type_info *size;
  undefined4 *in_FS_OFFSET;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  uVar4 = PAL_rand();
  __n = (type_info *)(ulong)((uVar4 % 0x32) * 8 + 8);
  local_60 = (undefined1  [8])&TrackedObject<1u,50u>::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_426b;
  data.filename._0_4_ = 0x110;
  data.typeinfo = __n;
  this = Memory::Recycler::TrackAllocInfo(recyclerInstance,(TrackAllocData *)local_60);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_001bab4d;
    *in_FS_OFFSET = 0;
  }
  size = __n + 0x20;
  data._32_8_ = (ulong)uVar4;
  memBlock = (RecyclerTestObject *)
             Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1204,false>
                       (this,(size_t)size);
  if (this->verifyEnabled == false) {
    memset(memBlock,0,(size_t)size);
  }
  else {
    (memBlock->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject = (_func_int **)0x0;
  }
  Memory::Recycler::VerifyPageHeapFillAfterAlloc
            (this,(char *)memBlock,(size_t)size,ClientTrackableLeafBits);
  if ((Js::Configuration::Global[0x2c156] == '\x01') &&
     (Js::Configuration::Global[0x2057e] == '\x01')) {
    pHVar6 = Memory::HeapBlockMap64::GetHeapBlock(&this->heapBlockMap,memBlock);
    (*pHVar6->_vptr_HeapBlock[4])(pHVar6);
  }
  uVar2 = data._32_8_;
  if (memBlock == (RecyclerTestObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_001bab4d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *in_FS_OFFSET = 0;
  }
  memBlock->generation = RecyclerTestObject::currentGeneration;
  (memBlock->super_IRecyclerVisitedObject)._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_00357260;
  memBlock[1].super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_003572b0;
  *(DWORD *)&memBlock[1].generation = (DWORD)uVar2 + (uVar4 / 0x32) * -0x32 + 1;
  memset(memBlock + 2,0,(size_t)__n);
  return memBlock;
}

Assistant:

static RecyclerTestObject * New()
    {
        unsigned int count = minCount + GetRandomInteger(maxCount - minCount + 1);

        return RecyclerNewTrackedLeafPlusZ(recyclerInstance, sizeof(RecyclerTestObject *) * count, TrackedObject, count);
    }